

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<24u,unsigned_char,void,false>::wr_string<char*>
          (uintwide_t<24u,unsigned_char,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  byte bVar1;
  undefined2 uVar2;
  byte abVar3 [2];
  byte abVar4 [2];
  long lVar5;
  unsigned_fast_type uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  byte bVar15;
  ushort uVar16;
  bool bVar17;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  uintwide_t<24U,_unsigned_char,_void,_false> local_54;
  byte local_50 [2];
  uintwide_t<24u,unsigned_char,void,false> local_4e;
  byte local_4c [2];
  uintwide_t<24u,unsigned_char,void,false> local_4a;
  byte local_48 [20];
  value_type_conflict4 local_34 [2];
  uintwide_t<24u,unsigned_char,void,false> local_32;
  
  iVar12 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar12 != 0x10) {
    if (iVar12 == 10) {
      local_4e = this[2];
      uVar2 = *(undefined2 *)this;
      local_50[0] = (value_type_conflict4)uVar2;
      local_50[1] = SUB21(uVar2,1);
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      local_48[4] = 0;
      local_48[5] = 0;
      local_48[6] = 0;
      local_48[7] = 0;
      local_48[8] = 0;
      local_48[9] = 0;
      local_48[10] = 0;
      local_48[0xb] = 0;
      local_48[0xc] = 0;
      local_48[0xd] = 0;
      local_48[0xe] = 0;
      local_48[0xf] = 0;
      local_48[0x10] = 0;
      if ((value_type_conflict4)uVar2 == '\0') {
        lVar5 = 0;
        do {
          lVar10 = lVar5;
          if (lVar10 == 2) goto LAB_00147181;
          lVar5 = lVar10 + 1;
        } while (local_50[lVar10 + 1] == 0);
        if (lVar10 == 2) {
LAB_00147181:
          local_48[0xf] = 0x30;
          uVar7 = 0xf;
LAB_0014718b:
          if (show_pos && 0 < (long)uVar7) {
            uVar7 = uVar7 - 1;
            local_48[uVar7 & 0xffffffff] = 0x2b;
          }
          if (field_width != 0) {
            lVar5 = 0;
            if (field_width < 0x11) {
              lVar5 = 0x10 - field_width;
            }
            while (lVar5 < (long)uVar7) {
              uVar7 = uVar7 - 1;
              local_48[uVar7 & 0xffffffff] = fill_char_str;
            }
          }
          local_48[0x10] = 0;
          lVar5 = 0;
          do {
            bVar15 = local_48[lVar5 + uVar7];
            str_result[lVar5] = bVar15;
            lVar5 = lVar5 + 1;
          } while (bVar15 != 0);
          return true;
        }
      }
      uVar7 = 0x10;
      do {
        local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)local_4e;
        abVar3 = local_50;
        if (local_50[0] == 0) {
          lVar5 = 0;
          do {
            bVar17 = lVar5 == 2;
            if (bVar17) break;
            lVar10 = lVar5 + 1;
            lVar5 = lVar5 + 1;
          } while (local_50[lVar10] == 0);
        }
        else {
          bVar17 = false;
        }
        if ((uVar7 == 0) || (bVar17)) goto LAB_0014718b;
        local_32 = local_4e;
        local_34[0] = local_50[0];
        local_34[1] = local_50[1];
        lVar5 = 2;
        uVar13 = 0;
        uVar14 = 0;
        do {
          uVar13 = (uVar14 + uVar13 * 0xf6) * 0x100;
          uVar14 = uVar13 | local_50[lVar5];
          uVar13 = (uVar13 & 0xffff | (uint)local_50[lVar5]) / 10;
          local_50[lVar5] = (byte)uVar13;
          abVar4 = local_50;
          bVar17 = lVar5 != 0;
          lVar5 = lVar5 + -1;
        } while (bVar17);
        local_4a = local_4e;
        local_4c[0] = local_50[0];
        local_4c[1] = local_50[1];
        lVar5 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + (uint)local_4c[lVar5] * 10;
          local_4c[lVar5] = (byte)uVar14;
          uVar14 = uVar14 >> 8;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_50[0] = abVar3[0];
        local_50[1] = abVar3[1];
        local_54.values.super_array<unsigned_char,_3UL>.elems[0] = local_50[0];
        local_54.values.super_array<unsigned_char,_3UL>.elems[1] = local_50[1];
        lVar5 = 0;
        uVar11 = 0;
        do {
          uVar16 = (local_54.values.super_array<unsigned_char,_3UL>.elems[lVar5] - uVar11) -
                   (ushort)local_4c[lVar5];
          uVar11 = (ushort)(0xff < uVar16);
          local_54.values.super_array<unsigned_char,_3UL>.elems[lVar5] =
               (value_type_conflict4)uVar16;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_48[uVar7 - 1 & 0xffffffff] =
             local_54.values.super_array<unsigned_char,_3UL>.elems[0] + 0x30;
        uVar7 = uVar7 - 1;
        local_50 = abVar4;
      } while( true );
    }
    if (iVar12 != 8) {
      return false;
    }
    local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)this[2];
    uVar2 = *(undefined2 *)this;
    local_54.values.super_array<unsigned_char,_3UL>.elems[0] = (value_type_conflict4)uVar2;
    local_54.values.super_array<unsigned_char,_3UL>.elems[1] = SUB21(uVar2,1);
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0xe] = 0;
    local_48[0xf] = 0;
    if ((value_type_conflict4)uVar2 == '\0') {
      lVar5 = 0;
      do {
        lVar10 = lVar5;
        if (lVar10 == 2) goto LAB_001472b4;
        lVar5 = lVar10 + 1;
      } while (local_54.values.super_array<unsigned_char,_3UL>.elems[lVar10 + 1] == '\0');
      if (lVar10 == 2) {
LAB_001472b4:
        local_48[0xe] = 0x30;
        uVar7 = 0xe;
LAB_001472be:
        if (show_base && 0 < (long)uVar7) {
          uVar7 = uVar7 - 1;
          local_48[uVar7 & 0xffffffff] = 0x30;
        }
        if (show_pos && 0 < (long)uVar7) {
          uVar7 = uVar7 - 1;
          local_48[uVar7 & 0xffffffff] = 0x2b;
        }
        if (field_width != 0) {
          uVar9 = 0xf;
          if (field_width < 0xf) {
            uVar9 = field_width;
          }
          uVar8 = uVar7;
          while ((long)(uVar9 ^ 0xf) < (long)uVar8) {
            uVar8 = uVar8 - 1;
            local_48[uVar8 & 0xffffffff] = fill_char_str;
            uVar7 = uVar9 ^ 0xf;
          }
        }
        local_48[0xf] = 0;
        lVar5 = 0;
        do {
          bVar15 = local_48[lVar5 + uVar7];
          str_result[lVar5] = bVar15;
          lVar5 = lVar5 + 1;
        } while (bVar15 != 0);
        return true;
      }
    }
    uVar7 = 0xf;
    do {
      if (local_54.values.super_array<unsigned_char,_3UL>.elems[0] == 0) {
        lVar5 = 0;
        do {
          bVar17 = lVar5 == 2;
          if (bVar17) break;
          lVar10 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (local_54.values.super_array<unsigned_char,_3UL>.elems[lVar10] == '\0');
      }
      else {
        bVar17 = false;
      }
      uVar9 = uVar7 - 1;
      if ((uVar7 == 0) || (bVar17)) goto LAB_001472be;
      local_48[uVar9 & 0xffffffff] =
           local_54.values.super_array<unsigned_char,_3UL>.elems[0] & 7 | 0x30;
      lVar5 = 2;
      bVar15 = 0;
      do {
        bVar1 = local_54.values.super_array<unsigned_char,_3UL>.elems[lVar5];
        local_54.values.super_array<unsigned_char,_3UL>.elems[lVar5] = bVar1 >> 3 | bVar15;
        bVar15 = bVar1 << 5;
        bVar17 = lVar5 != 0;
        lVar5 = lVar5 + -1;
        uVar7 = uVar9;
      } while (bVar17);
    } while( true );
  }
  local_54.values.super_array<unsigned_char,_3UL>.elems[2] = (value_type_conflict4)this[2];
  uVar2 = *(undefined2 *)this;
  local_54.values.super_array<unsigned_char,_3UL>.elems[0] = (value_type_conflict4)uVar2;
  local_54.values.super_array<unsigned_char,_3UL>.elems[1] = SUB21(uVar2,1);
  local_48[8] = 0;
  local_48[9] = 0;
  local_48[10] = 0;
  local_48[0xb] = 0;
  local_48[0xc] = 0;
  local_48[0xd] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  if ((value_type_conflict4)uVar2 == '\0') {
    lVar5 = 0;
    do {
      lVar10 = lVar5;
      if (lVar10 == 2) goto LAB_00147208;
      lVar5 = lVar10 + 1;
    } while (local_54.values.super_array<unsigned_char,_3UL>.elems[lVar10 + 1] == '\0');
    if (lVar10 == 2) {
LAB_00147208:
      local_48[0xc] = 0x30;
      uVar7 = 0xc;
      goto LAB_00147212;
    }
  }
  uVar6 = uintwide_t<24U,_unsigned_char,_void,_false>::extract_hex_digits<false,_nullptr>
                    (&local_54,(char *)(local_48 + 0xd),is_uppercase);
  uVar7 = 0xd - uVar6;
LAB_00147212:
  if ((show_base) && (1 < (long)uVar7)) {
    local_48[(int)uVar7 - 1] = !is_uppercase << 5 | 0x58;
    uVar7 = uVar7 - 2;
    local_48[uVar7 & 0xffffffff] = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar7)) {
    uVar7 = uVar7 - 1;
    local_48[uVar7 & 0xffffffff] = 0x2b;
  }
  if (field_width != 0) {
    lVar5 = 0;
    if (field_width < 0xe) {
      lVar5 = 0xd - field_width;
    }
    while (lVar5 < (long)uVar7) {
      uVar7 = uVar7 - 1;
      local_48[uVar7 & 0xffffffff] = fill_char_str;
    }
  }
  local_48[0xd] = 0;
  lVar5 = 0;
  do {
    bVar15 = local_48[lVar5 + uVar7];
    str_result[lVar5] = bVar15;
    lVar5 = lVar5 + 1;
  } while (bVar15 != 0);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }